

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O1

void blowfish_expandkey(BlowfishContext *ctx,void *vkey,short keybytes,void *vsalt,short saltbytes)

{
  uint *puVar1;
  BlowfishContext *pBVar2;
  BlowfishContext *ctx_00;
  ulong uVar3;
  int iVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  bool bVar9;
  uint32_t str [2];
  uchar dummysalt [1];
  uint32_t *S0;
  uint32_t local_44 [2];
  undefined1 local_39;
  BlowfishContext *local_38;
  
  local_38 = ctx;
  if (vsalt == (void *)0x0) {
    vsalt = &local_39;
    local_39 = 0;
    saltbytes = 1;
  }
  iVar6 = (int)keybytes;
  uVar3 = 0;
  do {
    iVar4 = (int)uVar3;
    uVar7 = (uint)*(byte *)((long)vkey +
                           ((long)((ulong)(uint)(iVar4 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) %
                            (long)iVar6 & 0xffffffffU)) << 0x18 ^ *(uint *)((long)ctx->P + uVar3);
    *(uint *)((long)ctx->P + uVar3) = uVar7;
    uVar7 = (uint)*(byte *)((long)vkey + ((long)(iVar4 + 1) % (long)iVar6 & 0xffffffffU)) << 0x10 ^
            uVar7;
    *(uint *)((long)ctx->P + uVar3) = uVar7;
    uVar7 = (uint)*(byte *)((long)vkey + ((long)(iVar4 + 2) % (long)iVar6 & 0xffffffffU)) << 8 ^
            uVar7;
    *(uint *)((long)ctx->P + uVar3) = uVar7;
    *(uint *)((long)ctx->P + uVar3) =
         *(byte *)((long)vkey + ((long)(iVar4 + 3) % (long)iVar6 & 0xffffffffU)) ^ uVar7;
    uVar3 = uVar3 + 4;
  } while (uVar3 != 0x48);
  local_44[0] = 0;
  local_44[1] = 0;
  iVar4 = (int)saltbytes;
  uVar3 = 0;
  iVar6 = 0;
  do {
    iVar8 = iVar6;
    bVar5 = 0;
    uVar7 = 0;
    do {
      puVar1 = (uint *)((long)local_44 + (ulong)(uVar7 & 0xfffffffc));
      *puVar1 = *puVar1 ^ (uint)*(byte *)((long)vsalt + (long)((int)(uVar7 + iVar8) % iVar4)) <<
                          (~bVar5 & 0x18);
      uVar7 = uVar7 + 1;
      bVar5 = bVar5 + 8;
    } while (uVar7 != 8);
    blowfish_encrypt(local_44[0],local_44[1],local_44,local_38);
    ctx->P[uVar3] = local_44[0];
    ctx->P[uVar3 + 1] = local_44[1];
    bVar9 = uVar3 < 0x10;
    uVar3 = uVar3 + 2;
    iVar6 = iVar8 + 8;
  } while (bVar9);
  uVar3 = 0;
  do {
    iVar6 = iVar8;
    iVar8 = iVar6 + 8;
    bVar5 = 0;
    uVar7 = 0;
    do {
      puVar1 = (uint *)((long)local_44 + (ulong)(uVar7 & 0xfffffffc));
      *puVar1 = *puVar1 ^ (uint)*(byte *)((long)vsalt + (long)((int)(iVar8 + uVar7) % iVar4)) <<
                          (~bVar5 & 0x18);
      pBVar2 = local_38;
      uVar7 = uVar7 + 1;
      bVar5 = bVar5 + 8;
    } while (uVar7 != 8);
    blowfish_encrypt(local_44[0],local_44[1],local_44,local_38);
    pBVar2->S0[uVar3] = local_44[0];
    pBVar2->S0[uVar3 + 1] = local_44[1];
    bVar9 = uVar3 < 0xfe;
    uVar3 = uVar3 + 2;
  } while (bVar9);
  uVar3 = 0;
  iVar6 = iVar6 + 0x10;
  do {
    iVar8 = iVar6;
    bVar5 = 0;
    uVar7 = 0;
    do {
      puVar1 = (uint *)((long)local_44 + (ulong)(uVar7 & 0xfffffffc));
      *puVar1 = *puVar1 ^ (uint)*(byte *)((long)vsalt + (long)((int)(uVar7 + iVar8) % iVar4)) <<
                          (~bVar5 & 0x18);
      pBVar2 = local_38;
      uVar7 = uVar7 + 1;
      bVar5 = bVar5 + 8;
    } while (uVar7 != 8);
    blowfish_encrypt(local_44[0],local_44[1],local_44,local_38);
    pBVar2->S1[uVar3] = local_44[0];
    pBVar2->S1[uVar3 + 1] = local_44[1];
    bVar9 = uVar3 < 0xfe;
    uVar3 = uVar3 + 2;
    iVar6 = iVar8 + 8;
  } while (bVar9);
  uVar3 = 0;
  do {
    iVar6 = iVar8;
    iVar8 = iVar6 + 8;
    bVar5 = 0;
    uVar7 = 0;
    do {
      puVar1 = (uint *)((long)local_44 + (ulong)(uVar7 & 0xfffffffc));
      *puVar1 = *puVar1 ^ (uint)*(byte *)((long)vsalt + (long)((int)(iVar8 + uVar7) % iVar4)) <<
                          (~bVar5 & 0x18);
      pBVar2 = local_38;
      uVar7 = uVar7 + 1;
      bVar5 = bVar5 + 8;
    } while (uVar7 != 8);
    blowfish_encrypt(local_44[0],local_44[1],local_44,local_38);
    ctx_00 = local_38;
    pBVar2->S2[uVar3] = local_44[0];
    pBVar2->S2[uVar3 + 1] = local_44[1];
    bVar9 = uVar3 < 0xfe;
    uVar3 = uVar3 + 2;
  } while (bVar9);
  iVar6 = iVar6 + 0x10;
  uVar3 = 0;
  do {
    bVar5 = 0;
    uVar7 = 0;
    do {
      puVar1 = (uint *)((long)local_44 + (ulong)(uVar7 & 0xfffffffc));
      *puVar1 = *puVar1 ^ (uint)*(byte *)((long)vsalt + (long)((int)(iVar6 + uVar7) % iVar4)) <<
                          (~bVar5 & 0x18);
      uVar7 = uVar7 + 1;
      bVar5 = bVar5 + 8;
    } while (uVar7 != 8);
    blowfish_encrypt(local_44[0],local_44[1],local_44,ctx_00);
    ctx_00->S3[uVar3] = local_44[0];
    ctx_00->S3[uVar3 + 1] = local_44[1];
    iVar6 = iVar6 + 8;
    bVar9 = uVar3 < 0xfe;
    uVar3 = uVar3 + 2;
  } while (bVar9);
  return;
}

Assistant:

void blowfish_expandkey(BlowfishContext * ctx,
                        const void *vkey, short keybytes,
                        const void *vsalt, short saltbytes)
{
    const unsigned char *key = (const unsigned char *)vkey;
    const unsigned char *salt = (const unsigned char *)vsalt;
    uint32_t *S0 = ctx->S0;
    uint32_t *S1 = ctx->S1;
    uint32_t *S2 = ctx->S2;
    uint32_t *S3 = ctx->S3;
    uint32_t *P = ctx->P;
    uint32_t str[2];
    int i, j;
    int saltpos;
    unsigned char dummysalt[1];

    saltpos = 0;
    if (!salt) {
        saltbytes = 1;
        salt = dummysalt;
        dummysalt[0] = 0;
    }

    for (i = 0; i < 18; i++) {
        P[i] ^=
            ((uint32_t) (unsigned char) (key[(i * 4 + 0) % keybytes])) << 24;
        P[i] ^=
            ((uint32_t) (unsigned char) (key[(i * 4 + 1) % keybytes])) << 16;
        P[i] ^=
            ((uint32_t) (unsigned char) (key[(i * 4 + 2) % keybytes])) << 8;
        P[i] ^= ((uint32_t) (unsigned char) (key[(i * 4 + 3) % keybytes]));
    }

    str[0] = str[1] = 0;

    for (i = 0; i < 18; i += 2) {
        for (j = 0; j < 8; j++)
            str[j/4] ^= ((uint32_t)salt[saltpos++ % saltbytes]) << (24-8*(j%4));

        blowfish_encrypt(str[0], str[1], str, ctx);
        P[i] = str[0];
        P[i + 1] = str[1];
    }

    for (i = 0; i < 256; i += 2) {
        for (j = 0; j < 8; j++)
            str[j/4] ^= ((uint32_t)salt[saltpos++ % saltbytes]) << (24-8*(j%4));
        blowfish_encrypt(str[0], str[1], str, ctx);
        S0[i] = str[0];
        S0[i + 1] = str[1];
    }
    for (i = 0; i < 256; i += 2) {
        for (j = 0; j < 8; j++)
            str[j/4] ^= ((uint32_t)salt[saltpos++ % saltbytes]) << (24-8*(j%4));
        blowfish_encrypt(str[0], str[1], str, ctx);
        S1[i] = str[0];
        S1[i + 1] = str[1];
    }
    for (i = 0; i < 256; i += 2) {
        for (j = 0; j < 8; j++)
            str[j/4] ^= ((uint32_t)salt[saltpos++ % saltbytes]) << (24-8*(j%4));
        blowfish_encrypt(str[0], str[1], str, ctx);
        S2[i] = str[0];
        S2[i + 1] = str[1];
    }
    for (i = 0; i < 256; i += 2) {
        for (j = 0; j < 8; j++)
            str[j/4] ^= ((uint32_t)salt[saltpos++ % saltbytes]) << (24-8*(j%4));
        blowfish_encrypt(str[0], str[1], str, ctx);
        S3[i] = str[0];
        S3[i + 1] = str[1];
    }
}